

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

void adt_list_insert_before(adt_list_t *self,adt_list_elem_t *pIter,void *pItem)

{
  adt_list_elem_t *paVar1;
  adt_list_elem_t *pElem;
  void *pItem_local;
  adt_list_elem_t *pIter_local;
  adt_list_t *self_local;
  
  if ((((self != (adt_list_t *)0x0) && (pIter != (adt_list_elem_t *)0x0)) && (pItem != (void *)0x0))
     && (paVar1 = adt_list_elem_new(pItem,pIter,pIter->pPrev), paVar1 != (adt_list_elem_t *)0x0)) {
    if (pIter->pPrev != (adt_list_elem_tag *)0x0) {
      pIter->pPrev->pNext = paVar1;
    }
    pIter->pPrev = paVar1;
    if (self->pFirst == pIter) {
      self->pFirst = paVar1;
    }
  }
  return;
}

Assistant:

void adt_list_insert_before(adt_list_t *self, adt_list_elem_t *pIter, void *pItem)
{
   if( (self != 0) && (pIter != 0) && (pItem != 0) )
   {
      adt_list_elem_t *pElem = adt_list_elem_new(pItem,pIter, pIter->pPrev);
      if (pElem != 0)
      {
         if (pIter->pPrev != 0)
         {
            pIter->pPrev->pNext = pElem;
         }
         pIter->pPrev = pElem;
         //adjust pFirst if we are inserting at beginning of list
         if (self->pFirst == pIter)
         {
            self->pFirst = pElem;
         }
      }
   }
}